

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall helics::apps::Player::runTo(Player *this,Time stopTime_input)

{
  char cVar1;
  long lVar2;
  _func_int *p_Var3;
  ostream *poVar4;
  pointer pVVar5;
  ulong uVar6;
  pointer pMVar7;
  int iteration;
  ulong uVar8;
  element_type *peVar9;
  Federate *this_00;
  Time TVar10;
  int iVar11;
  long local_38;
  
  peVar9 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cVar1 = *(char *)((long)&(peVar9->super_ValueFederate).vfManager._M_t.
                           super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                           .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>.
                           _M_head_impl +
                   (long)(peVar9->super_ValueFederate)._vptr_ValueFederate[-3]);
  if (cVar1 == '\0') {
    (*(this->super_App)._vptr_App[2])(this);
  }
  else if ('\x01' < cVar1) {
    peVar9 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pVVar5 = (this->points).
             super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = *(long *)(&(peVar9->super_ValueFederate).field_0x28 +
                     (long)(peVar9->super_ValueFederate)._vptr_ValueFederate[-3]);
    uVar6 = this->pointIndex;
    uVar8 = (long)(this->points).
                  super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 7;
    if (uVar6 < uVar8) {
      pVVar5 = pVVar5 + uVar6;
      do {
        if (lVar2 < (pVVar5->time).internalTimeCode) break;
        uVar6 = uVar6 + 1;
        this->pointIndex = uVar6;
        pVVar5 = pVVar5 + 1;
      } while (uVar6 < uVar8);
    }
    uVar6 = this->messageIndex;
    pMVar7 = (this->messages).
             super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->messages).
                   super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar7 >> 4) *
            -0xf0f0f0f0f0f0f0f;
    if (uVar6 <= uVar8 && uVar8 - uVar6 != 0) {
      pMVar7 = pMVar7 + uVar6;
      do {
        if (lVar2 < (pMVar7->sendTime).internalTimeCode) break;
        uVar6 = uVar6 + 1;
        this->messageIndex = uVar6;
        pMVar7 = pMVar7 + 1;
      } while (uVar6 < uVar8);
    }
    goto LAB_001c1ecb;
  }
  sendInformation(this,(Time)0xffffffffffffffff,0);
  peVar9 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Federate::enterExecutingMode
            ((Federate *)
             ((long)&(peVar9->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar9->super_ValueFederate)._vptr_ValueFederate[-3]),NO_ITERATIONS);
  sendInformation(this,(Time)0x0,0);
LAB_001c1ecb:
  local_38 = (this->nextPrintTimeStep).internalTimeCode;
  if (local_38 < 1) {
    local_38 = 0x7fffffffffffffff;
  }
  iVar11 = 0;
  do {
    iteration = 0;
LAB_001c1eec:
    do {
      uVar6 = this->pointIndex;
      pVVar5 = (this->points).
               super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      TVar10.internalTimeCode = 0x7fffffffffffffff;
      if (uVar6 < (ulong)((long)(this->points).
                                super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 7)) {
        TVar10.internalTimeCode = pVVar5[uVar6].time.internalTimeCode;
        iVar11 = pVVar5[uVar6].iteration;
      }
      uVar6 = this->messageIndex;
      pMVar7 = (this->messages).
               super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->messages).
                     super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar7 >> 4) *
              -0xf0f0f0f0f0f0f0f;
      if (uVar6 <= uVar8 && uVar8 - uVar6 != 0) {
        lVar2 = pMVar7[uVar6].sendTime.internalTimeCode;
        if (lVar2 < TVar10.internalTimeCode) {
          TVar10.internalTimeCode = lVar2;
        }
        iVar11 = 0;
      }
      if (TVar10.internalTimeCode == 0x7fffffffffffffff) {
        peVar9 = (this->super_App).fed.
                 super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_001c2064:
        p_Var3 = (peVar9->super_ValueFederate)._vptr_ValueFederate[-3];
        if (*(long *)(&(peVar9->super_ValueFederate).field_0x28 + (long)p_Var3) <
            stopTime_input.internalTimeCode) {
          this_00 = (Federate *)
                    ((long)&(peVar9->super_ValueFederate)._vptr_ValueFederate + (long)p_Var3);
          do {
            Federate::requestTime(this_00,stopTime_input);
            peVar9 = (this->super_App).fed.
                     super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            p_Var3 = (peVar9->super_ValueFederate)._vptr_ValueFederate[-3];
            this_00 = (Federate *)
                      ((long)&(peVar9->super_ValueFederate)._vptr_ValueFederate + (long)p_Var3);
          } while (*(long *)(&(peVar9->super_ValueFederate).field_0x28 + (long)p_Var3) <
                   stopTime_input.internalTimeCode);
        }
        return;
      }
      peVar9 = (this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (stopTime_input.internalTimeCode < TVar10.internalTimeCode) goto LAB_001c2064;
      p_Var3 = (peVar9->super_ValueFederate)._vptr_ValueFederate[-3];
      if ((iVar11 != 0) &&
         (TVar10.internalTimeCode <=
          *(long *)(&(peVar9->super_ValueFederate).field_0x28 + (long)p_Var3))) {
        Federate::requestTimeIterative
                  ((Federate *)
                   ((long)&(peVar9->super_ValueFederate)._vptr_ValueFederate + (long)p_Var3),TVar10,
                   FORCE_ITERATION);
        iteration = iteration + 1;
        sendInformation(this,TVar10,iteration);
        goto LAB_001c1eec;
      }
      TVar10 = Federate::requestTime
                         ((Federate *)
                          ((long)&(peVar9->super_ValueFederate)._vptr_ValueFederate + (long)p_Var3),
                          TVar10);
      iteration = 0;
      sendInformation(this,TVar10,0);
    } while (TVar10.internalTimeCode < local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"processed for time ",0x13);
    poVar4 = std::ostream::_M_insert<double>
                       ((double)(TVar10.internalTimeCode % 1000000000) * 1e-09 +
                        (double)(TVar10.internalTimeCode / 1000000000));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    local_38 = local_38 + (this->nextPrintTimeStep).internalTimeCode;
  } while( true );
}

Assistant:

void Player::runTo(Time stopTime_input)
{
    auto md = fed->getCurrentMode();
    if (md == Federate::Modes::STARTUP) {
        initialize();
    }
    if (md < Federate::Modes::EXECUTING) {
        sendInformation(-Time::epsilon());

        fed->enterExecutingMode();
        // send the stuff at timeZero
        sendInformation(timeZero);
    } else {
        auto ctime = fed->getCurrentTime();
        if (isValidIndex(pointIndex, points)) {
            while (points[pointIndex].time <= ctime) {
                ++pointIndex;
                if (pointIndex >= points.size()) {
                    break;
                }
            }
        }
        if (isValidIndex(messageIndex, messages)) {
            while (messages[messageIndex].sendTime <= ctime) {
                ++messageIndex;
                if (messageIndex >= messages.size()) {
                    break;
                }
            }
        }
    }

    Time nextPrintTime = (nextPrintTimeStep > timeZero) ? nextPrintTimeStep : Time::maxVal();
    bool moreToSend{true};
    int nextIteration{0};
    int currentIteration{0};
    while (moreToSend) {
        auto nextSendTime = Time::maxVal();
        if (isValidIndex(pointIndex, points)) {
            nextSendTime = std::min(nextSendTime, points[pointIndex].time);
            nextIteration = points[pointIndex].iteration;
        }
        if (isValidIndex(messageIndex, messages)) {
            nextSendTime = std::min(nextSendTime, messages[messageIndex].sendTime);
            nextIteration = 0;
        }
        if (nextSendTime == Time::maxVal()) {
            moreToSend = false;
            continue;
        }
        if (nextSendTime > stopTime_input) {
            break;
        }

        if ((nextIteration == 0) || (nextSendTime > fed->getCurrentTime())) {
            auto newTime = fed->requestTime(nextSendTime);
            currentIteration = 0;
            sendInformation(newTime, currentIteration);

            if (newTime >= nextPrintTime) {
                std::cout << "processed for time " << static_cast<double>(newTime) << "\n";
                nextPrintTime += nextPrintTimeStep;
            }
        } else {
            fed->requestTimeIterative(nextSendTime, IterationRequest::FORCE_ITERATION);
            ++currentIteration;
            sendInformation(nextSendTime, currentIteration);
        }
    }
    while (fed->getCurrentTime() < stopTime_input) {
        fed->requestTime(stopTime_input);
    }
}